

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterBuffer.h
# Opt level: O3

hash_t __thiscall JsUtil::CharacterBuffer::operator_cast_to_unsigned_int(CharacterBuffer *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  long lVar5;
  ulong uVar6;
  
  lVar5 = *(long *)this;
  if (lVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/CharacterBuffer.h"
                       ,0x20,"(string != nullptr)","string != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    lVar5 = *(long *)this;
  }
  uVar3 = 0x811c9dc5;
  if ((ulong)*(uint *)(this + 8) != 0) {
    uVar6 = 0;
    do {
      uVar3 = (*(ushort *)(lVar5 + uVar6 * 2) ^ uVar3) * 0x1000193;
      uVar6 = uVar6 + 1;
    } while (*(uint *)(this + 8) != uVar6);
  }
  return uVar3;
}

Assistant:

operator hash_t() const
        {
            Assert(string != nullptr);
            return StaticGetHashCode(string, len);
        }